

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarymodelserialiser.cpp
# Opt level: O0

bool __thiscall BinaryModelSerialiser::loadModel(BinaryModelSerialiser *this,QByteArray *source)

{
  Version v;
  BinaryModelSerialiserPrivate *this_00;
  QDataStream local_48 [8];
  QDataStream reader;
  BinaryModelSerialiserPrivate *d;
  QByteArray *source_local;
  BinaryModelSerialiser *this_local;
  
  this_00 = d_func(this);
  if ((this_00->super_AbstractModelSerialiserPrivate).m_model == (QAbstractItemModel *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    QDataStream::QDataStream(local_48,(QByteArray *)source);
    v = AbstractModelSerialiser::streamVersion(&this->super_AbstractModelSerialiser);
    QDataStream::setVersion(local_48,v);
    this_local._7_1_ = BinaryModelSerialiserPrivate::readBinary(this_00,local_48);
    QDataStream::~QDataStream(local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool BinaryModelSerialiser::loadModel(const QByteArray &source)
{
    Q_D(BinaryModelSerialiser);

    if (!d->m_model)
        return false;
    QDataStream reader(source);
    reader.setVersion(streamVersion());
    return d->readBinary(reader);
}